

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall
Omega_h::interpolate_between_metrics(Omega_h *this,LO nmetrics,Reals *a,Reals *b,Real t)

{
  void *extraout_RDX;
  Reals RVar1;
  Reals log_c;
  Reals log_b;
  Reals log_a;
  Write<double> local_a8;
  Write<double> local_98;
  Write<double> local_88;
  Write<double> local_78;
  Write<double> local_68;
  Write<double> local_58;
  Write<double> local_48;
  Write<double> local_38;
  
  Write<double>::Write(&local_38,&a->write_);
  linearize_metrics((Omega_h *)&local_48,nmetrics,(Reals *)&local_38);
  Write<double>::~Write(&local_38);
  Write<double>::Write(&local_68,&b->write_);
  linearize_metrics((Omega_h *)&local_58,nmetrics,(Reals *)&local_68);
  Write<double>::~Write(&local_68);
  Write<double>::Write(&local_88,&local_48);
  Write<double>::Write(&local_98,&local_58);
  interpolate_between((Omega_h *)&local_78,(Reals *)&local_88,(Reals *)&local_98,t);
  Write<double>::~Write(&local_98);
  Write<double>::~Write(&local_88);
  Write<double>::Write(&local_a8,&local_78);
  delinearize_metrics(this,nmetrics,(Reals *)&local_a8);
  Write<double>::~Write(&local_a8);
  Write<double>::~Write(&local_78);
  Write<double>::~Write(&local_58);
  Write<double>::~Write(&local_48);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals interpolate_between_metrics(LO nmetrics, Reals a, Reals b, Real t) {
  auto log_a = linearize_metrics(nmetrics, a);
  auto log_b = linearize_metrics(nmetrics, b);
  auto log_c = interpolate_between(log_a, log_b, t);
  return delinearize_metrics(nmetrics, log_c);
}